

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_49465::JSONParser::~JSONParser(JSONParser *this)

{
  pointer pcVar1;
  pointer pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pSVar4;
  
  pcVar1 = (this->dict_key)._M_dataplus._M_p;
  paVar3 = &(this->dict_key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pSVar4 = (this->stack).
           super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->stack).
           super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar2) {
    do {
      this_00 = (pSVar4->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar2);
    pSVar4 = (this->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pSVar4 != (pointer)0x0) {
    operator_delete(pSVar4,(long)(this->stack).
                                 super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4);
  }
  pcVar1 = (this->token)._M_dataplus._M_p;
  paVar3 = &(this->token).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

JSONParser(InputSource& is, JSON::Reactor* reactor) :
            is(is),
            reactor(reactor),
            p(buf)
        {
        }